

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_2::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  bool bVar2;
  Colour colour;
  
  bVar2 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar2) {
    colour.m_moved = false;
    Colour::use(FileName);
    std::operator<<(this->stream," for: ");
    Colour::~Colour(&colour);
    poVar1 = this->stream;
    AssertionResult::getExpandedExpression_abi_cxx11_((string *)&colour,this->result);
    std::operator<<(poVar1,(string *)&colour);
    std::__cxx11::string::~string((string *)&colour);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
        if (result.hasExpandedExpression()) {
            {
                Colour colour(dimColour());
                stream << " for: ";
            }
            stream << result.getExpandedExpression();
        }
    }